

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O0

void Imf_2_5::Attribute::unRegisterAttributeType(char *typeName)

{
  Lock lock;
  LockedTypeMap *tMap;
  key_type *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  Mutex *in_stack_ffffffffffffffd8;
  Lock *in_stack_ffffffffffffffe0;
  
  anon_unknown_0::typeMap();
  IlmThread_2_5::Lock::Lock
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
  std::
  map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
  ::erase((map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
           *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
         );
  IlmThread_2_5::Lock::~Lock((Lock *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

void
Attribute::unRegisterAttributeType (const char typeName[])
{
    LockedTypeMap& tMap = typeMap();
    Lock lock (tMap.mutex);

    tMap.erase (typeName);
}